

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uvccapture2.cpp
# Opt level: O1

bool __thiscall V4L2Device::check_capabilities(V4L2Device *this)

{
  int iVar1;
  Writer *pWVar2;
  int *piVar3;
  char *__s;
  size_t sVar4;
  undefined1 *puVar5;
  v4l2_capability cap;
  Writer local_f8;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  
  local_38 = 0;
  uStack_30 = 0;
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_68 = 0;
  uStack_60 = 0;
  local_78 = 0;
  uStack_70 = 0;
  local_88 = 0;
  uStack_80 = 0;
  local_28 = 0;
  iVar1 = ioctl(this->fd,0x80685600);
  if (iVar1 < 0) {
    local_f8._vptr_Writer = (_func_int **)&PTR__Writer_00164080;
    local_f8.m_level = Error;
    local_f8.m_file =
         "/workspace/llm4binary/github/license_all_cmakelists_25/thekvs[P]uvccapture2/src/uvccapture2.cpp"
    ;
    local_f8.m_line = 0x131;
    local_f8.m_func = "bool V4L2Device::check_capabilities()";
    local_f8.m_verboseLevel = 0;
    local_f8.m_logger = (Logger *)0x0;
    local_f8.m_proceed = false;
    local_f8.m_messageBuilder.m_logger = (Logger *)0x0;
    local_f8.m_messageBuilder.m_containerLogSeperator = "";
    local_f8.m_dispatchAction = NormalLog;
    local_f8.m_loggerIds.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_f8.m_loggerIds.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_f8.m_loggerIds.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pWVar2 = el::base::Writer::construct(&local_f8,1,"default");
    if ((pWVar2->m_proceed == true) &&
       (std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&((pWVar2->m_messageBuilder).m_logger)->field_0x50,
                   "VIDIOC_QUERYCAP failed: ",0x18),
       (*(byte *)(el::base::elStorage + 0x21) & 0x20) != 0)) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&((pWVar2->m_messageBuilder).m_logger)->field_0x50," ",1);
    }
    piVar3 = __errno_location();
    __s = strerror(*piVar3);
    if (pWVar2->m_proceed == true) {
      puVar5 = &((pWVar2->m_messageBuilder).m_logger)->field_0x50;
      if (__s == (char *)0x0) {
        std::ios::clear((int)puVar5 + (int)*(undefined8 *)(*(long *)puVar5 + -0x18));
      }
      else {
        sVar4 = strlen(__s);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar5,__s,sVar4);
      }
      if ((*(byte *)(el::base::elStorage + 0x21) & 0x20) != 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&((pWVar2->m_messageBuilder).m_logger)->field_0x50," ",1);
      }
    }
  }
  else if ((local_38 & 0x100000000) == 0) {
    local_f8._vptr_Writer = (_func_int **)&PTR__Writer_00164080;
    local_f8.m_level = Error;
    local_f8.m_file =
         "/workspace/llm4binary/github/license_all_cmakelists_25/thekvs[P]uvccapture2/src/uvccapture2.cpp"
    ;
    local_f8.m_line = 0x136;
    local_f8.m_func = "bool V4L2Device::check_capabilities()";
    local_f8.m_verboseLevel = 0;
    local_f8.m_logger = (Logger *)0x0;
    local_f8.m_proceed = false;
    local_f8.m_messageBuilder.m_logger = (Logger *)0x0;
    local_f8.m_messageBuilder.m_containerLogSeperator = "";
    local_f8.m_dispatchAction = NormalLog;
    local_f8.m_loggerIds.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_f8.m_loggerIds.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_f8.m_loggerIds.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pWVar2 = el::base::Writer::construct(&local_f8,1,"default");
    if ((pWVar2->m_proceed == true) &&
       (std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&((pWVar2->m_messageBuilder).m_logger)->field_0x50,
                   "The device does not handle single-planar video capture",0x36),
       (*(byte *)(el::base::elStorage + 0x21) & 0x20) != 0)) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&((pWVar2->m_messageBuilder).m_logger)->field_0x50," ",1);
    }
  }
  else {
    if ((local_38._4_4_ >> 0x1a & 1) != 0) {
      return true;
    }
    local_f8._vptr_Writer = (_func_int **)&PTR__Writer_00164080;
    local_f8.m_level = Error;
    local_f8.m_file =
         "/workspace/llm4binary/github/license_all_cmakelists_25/thekvs[P]uvccapture2/src/uvccapture2.cpp"
    ;
    local_f8.m_line = 0x13b;
    local_f8.m_func = "bool V4L2Device::check_capabilities()";
    local_f8.m_verboseLevel = 0;
    local_f8.m_logger = (Logger *)0x0;
    local_f8.m_proceed = false;
    local_f8.m_messageBuilder.m_logger = (Logger *)0x0;
    local_f8.m_messageBuilder.m_containerLogSeperator = "";
    local_f8.m_dispatchAction = NormalLog;
    local_f8.m_loggerIds.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_f8.m_loggerIds.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_f8.m_loggerIds.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pWVar2 = el::base::Writer::construct(&local_f8,1,"default");
    if ((pWVar2->m_proceed == true) &&
       (std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&((pWVar2->m_messageBuilder).m_logger)->field_0x50,
                   "The device does not handle frame streaming",0x2a),
       (*(byte *)(el::base::elStorage + 0x21) & 0x20) != 0)) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&((pWVar2->m_messageBuilder).m_logger)->field_0x50," ",1);
    }
  }
  el::base::Writer::~Writer(&local_f8);
  return false;
}

Assistant:

bool
    check_capabilities()
    {
        struct v4l2_capability cap;
        std::memset(&cap, 0, sizeof(cap));

        if (ioctl(fd, VIDIOC_QUERYCAP, &cap) < 0) {
            LOG(ERROR) << "VIDIOC_QUERYCAP failed: " << strerror(errno);
            return false;
        }

        if ((cap.capabilities & V4L2_CAP_VIDEO_CAPTURE) == 0) {
            LOG(ERROR) << "The device does not handle single-planar video capture";
            return false;
        }

        if ((cap.capabilities & V4L2_CAP_STREAMING) == 0) {
            LOG(ERROR) << "The device does not handle frame streaming";
            return false;
        }

        return true;
    }